

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcMemberType::~IfcMemberType(IfcMemberType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x86b980;
  *(undefined8 *)&this->field_0x30 = 0x86ba98;
  *(undefined8 *)&this[-1].field_0xd0 = 0x86b9a8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x86b9d0;
  *(undefined8 *)&this[-1].field_0x138 = 0x86b9f8;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x86ba20;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x86ba48;
  *(undefined8 *)this = 0x86ba70;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x86bd60;
  *(undefined8 *)&this->field_0x30 = 0x86be28;
  *(undefined8 *)&this[-1].field_0xd0 = 0x86bd88;
  *(undefined8 *)&this[-1].field_0xe0 = 0x86bdb0;
  *(undefined8 *)&this[-1].field_0x138 = 0x86bdd8;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x86be00;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>.field_0x20
     ) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__0086bac0);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcMemberType() : Object("IfcMemberType") {}